

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O3

void sobelFilter(Mat *image)

{
  Mat out;
  Mat abs_grad_y;
  Mat grad_y;
  Mat abs_grad_x;
  Mat grad_x;
  _InputArray local_250;
  _InputArray local_238 [4];
  _OutputArray local_1d8;
  _InputArray local_1c0;
  _InputArray local_1a8 [4];
  _InputArray local_148 [4];
  _InputArray local_e8 [4];
  Mat local_88 [96];
  
  cv::Mat::Mat(local_88);
  local_e8[0].sz.width = 0;
  local_e8[0].sz.height = 0;
  local_e8[0].flags = 0x1010000;
  local_148[0].sz.width = 0;
  local_148[0].sz.height = 0;
  local_148[0].flags = 0x2010000;
  local_148[0].obj = local_88;
  local_e8[0].obj = image;
  cv::Sobel(local_e8,(_OutputArray *)local_148,*(uint *)image & 7,1,0,3,1.0,0.0,4);
  cv::Mat::Mat((Mat *)local_e8);
  local_148[0].sz.width = 0;
  local_148[0].sz.height = 0;
  local_148[0].flags = 0x1010000;
  local_1a8[0].sz.width = 0;
  local_1a8[0].sz.height = 0;
  local_1a8[0].flags = 0x2010000;
  local_1a8[0].obj = local_e8;
  local_148[0].obj = local_88;
  cv::convertScaleAbs(local_148,(_OutputArray *)local_1a8,1.0,0.0);
  cv::Mat::Mat((Mat *)local_148);
  local_1a8[0].sz.width = 0;
  local_1a8[0].sz.height = 0;
  local_1a8[0].flags = 0x1010000;
  local_238[0].sz.width = 0;
  local_238[0].sz.height = 0;
  local_238[0].flags = 0x2010000;
  local_238[0].obj = local_148;
  local_1a8[0].obj = image;
  cv::Sobel(local_1a8,(_OutputArray *)local_238,*(uint *)image & 7,0,1,3,1.0,0.0,4);
  cv::Mat::Mat((Mat *)local_1a8);
  local_238[0].sz.width = 0;
  local_238[0].sz.height = 0;
  local_238[0].flags = 0x1010000;
  local_250.sz.width = 0;
  local_250.sz.height = 0;
  local_250.flags = 0x2010000;
  local_250.obj = local_1a8;
  local_238[0].obj = local_148;
  cv::convertScaleAbs(local_238,(_OutputArray *)&local_250,1.0,0.0);
  cv::Mat::Mat((Mat *)local_238);
  local_250.sz.width = 0;
  local_250.sz.height = 0;
  local_250.flags = 0x1010000;
  local_1c0.sz.width = 0;
  local_1c0.sz.height = 0;
  local_1c0.flags = 0x1010000;
  local_1d8.super__InputArray.sz.width = 0;
  local_1d8.super__InputArray.sz.height = 0;
  local_1d8.super__InputArray.flags = 0x2010000;
  local_250.obj = local_e8;
  local_1d8.super__InputArray.obj = local_238;
  local_1c0.obj = local_1a8;
  cv::addWeighted(&local_250,0.5,&local_1c0,0.5,0.0,&local_1d8,-1);
  cv::Mat::operator=(image,(Mat *)local_238);
  cv::Mat::~Mat((Mat *)local_238);
  cv::Mat::~Mat((Mat *)local_1a8);
  cv::Mat::~Mat((Mat *)local_148);
  cv::Mat::~Mat((Mat *)local_e8);
  cv::Mat::~Mat(local_88);
  return;
}

Assistant:

void sobelFilter(cv::Mat & image) {
	cv::Mat grad_x;
	cv::Sobel(image, grad_x, image.depth(), 1, 0);
	cv::Mat abs_grad_x;
	cv::convertScaleAbs(grad_x, abs_grad_x);

	cv::Mat grad_y;
	cv::Sobel(image, grad_y, image.depth(), 0, 1);
	cv::Mat abs_grad_y;
	cv::convertScaleAbs(grad_y, abs_grad_y);

	cv::Mat out;
	cv::addWeighted(abs_grad_x, 0.5, abs_grad_y, 0.5, 0, out);

	image = out;
}